

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

void IR::Opnd::DumpFunctionInfo
               (char16 **buffer,size_t *count,FunctionInfo *info,bool printToConsole,char16 *type)

{
  FunctionProxy *this;
  int iVar1;
  undefined4 extraout_var;
  char16 *pcVar2;
  undefined7 in_register_00000009;
  char16_t *pcVar3;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  this = (info->functionBodyImpl).ptr;
  if (this != (FunctionProxy *)0x0) {
    pcVar3 = L"FunctionBody";
    if (type != (char16 *)0x0) {
      pcVar3 = type;
    }
    iVar1 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])
                      (this,count,info,CONCAT71(in_register_00000009,printToConsole));
    pcVar2 = Js::FunctionProxy::GetDebugNumberSet(this,(wchar (*) [42])local_88);
    WriteToBuffer(buffer,count,L" (%s [%s%s])",pcVar3,CONCAT44(extraout_var,iVar1),pcVar2);
    return;
  }
  pcVar3 = L"FunctionInfo";
  if (type != (char16 *)0x0) {
    pcVar3 = type;
  }
  WriteToBuffer(buffer,count,L" (%s)",pcVar3);
  return;
}

Assistant:

void
Opnd::DumpFunctionInfo(_Outptr_result_buffer_(*count) char16 ** buffer, size_t * count, Js::FunctionInfo * info, bool printToConsole, _In_opt_z_ char16 const * type)
{
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    if (info->HasBody())
    {
        if (type == nullptr)
        {
            type = _u("FunctionBody");
        }
        Js::FunctionProxy * proxy = info->GetFunctionProxy();
        WriteToBuffer(buffer, count, _u(" (%s [%s%s])"), type, proxy->GetDisplayName(), proxy->GetDebugNumberSet(debugStringBuffer));
    }
    else
    {
        if (type == nullptr)
        {
            type = _u("FunctionInfo");
        }
        WriteToBuffer(buffer, count, _u(" (%s)"), type);
    }
}